

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O1

int ps_search_forward(ps_decoder_t *ps)

{
  bool bVar1;
  int iVar2;
  int unaff_EBP;
  int iVar3;
  
  if (ps->search == (ps_search_t *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
            ,0x49b,
            "No search module is selected, did you forget to specify a language model or grammar?\n"
           );
    iVar2 = -1;
  }
  else {
    iVar3 = 0;
    do {
      if (ps->acmod->n_feat_frame < 1) {
        return iVar3;
      }
      if (((ps->pl_window < 1) ||
          (iVar2 = (*ps->phone_loop->vt->step)(ps->phone_loop,ps->acmod->output_frame), -1 < iVar2))
         && ((iVar2 = ps->acmod->output_frame, iVar2 < ps->pl_window ||
             (iVar2 = (*ps->search->vt->step)(ps->search,iVar2 - ps->pl_window), -1 < iVar2)))) {
        acmod_advance(ps->acmod);
        ps->n_frame = ps->n_frame + 1;
        iVar3 = iVar3 + 1;
        bVar1 = true;
        iVar2 = unaff_EBP;
      }
      else {
        bVar1 = false;
      }
      unaff_EBP = iVar2;
    } while (bVar1);
  }
  return iVar2;
}

Assistant:

static int
ps_search_forward(ps_decoder_t *ps)
{
    int nfr;

    if (ps->search == NULL) {
        E_ERROR("No search module is selected, did you forget to "
                "specify a language model or grammar?\n");
        return -1;
    }
    nfr = 0;
    while (ps->acmod->n_feat_frame > 0) {
        int k;
        if (ps->pl_window > 0)
            if ((k = ps_search_step(ps->phone_loop, ps->acmod->output_frame)) < 0)
                return k;
        if (ps->acmod->output_frame >= ps->pl_window)
            if ((k = ps_search_step(ps->search,
                                    ps->acmod->output_frame - ps->pl_window)) < 0)
                return k;
        acmod_advance(ps->acmod);
        ++ps->n_frame;
        ++nfr;
    }
    return nfr;
}